

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O0

void Abc_NtkStrashPerform(Abc_Ntk_t *pNtkOld,Abc_Ntk_t *pNtkNew,int fAllNodes,int fRecord)

{
  int iVar1;
  Vec_Ptr_t *p;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pAVar2;
  int local_34;
  int i;
  Abc_Obj_t *pNodeOld;
  Vec_Ptr_t *vNodes;
  int fRecord_local;
  int fAllNodes_local;
  Abc_Ntk_t *pNtkNew_local;
  Abc_Ntk_t *pNtkOld_local;
  
  iVar1 = Abc_NtkIsLogic(pNtkOld);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsLogic(pNtkOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcStrash.c"
                  ,0x1a2,"void Abc_NtkStrashPerform(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
  }
  iVar1 = Abc_NtkIsStrash(pNtkNew);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcStrash.c"
                  ,0x1a3,"void Abc_NtkStrashPerform(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
  }
  p = Abc_NtkDfsIter(pNtkOld,fAllNodes);
  for (local_34 = 0; iVar1 = Vec_PtrSize(p), local_34 < iVar1; local_34 = local_34 + 1) {
    pObj = (Abc_Obj_t *)Vec_PtrEntry(p,local_34);
    iVar1 = Abc_ObjIsBarBuf(pObj);
    if (iVar1 == 0) {
      pAVar2 = Abc_NodeStrash(pNtkNew,pObj,fRecord);
      (pObj->field_6).pCopy = pAVar2;
    }
    else {
      pAVar2 = Abc_ObjChild0Copy(pObj);
      (pObj->field_6).pCopy = pAVar2;
    }
  }
  Vec_PtrFree(p);
  return;
}

Assistant:

void Abc_NtkStrashPerform( Abc_Ntk_t * pNtkOld, Abc_Ntk_t * pNtkNew, int fAllNodes, int fRecord )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNodeOld;
    int i; //, clk = Abc_Clock();
    assert( Abc_NtkIsLogic(pNtkOld) );
    assert( Abc_NtkIsStrash(pNtkNew) );
//    vNodes = Abc_NtkDfs( pNtkOld, fAllNodes );
    vNodes = Abc_NtkDfsIter( pNtkOld, fAllNodes );
//printf( "Nodes = %d. ", Vec_PtrSize(vNodes) );
//ABC_PRT( "Time", Abc_Clock() - clk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNodeOld, i )
    {
        if ( Abc_ObjIsBarBuf(pNodeOld) )
            pNodeOld->pCopy = Abc_ObjChild0Copy(pNodeOld);
        else
            pNodeOld->pCopy = Abc_NodeStrash( pNtkNew, pNodeOld, fRecord );
    }
    Vec_PtrFree( vNodes );
}